

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O0

int IDAGetLinWorkSpace(void *ida_mem,long *lenrwLS,long *leniwLS)

{
  int iVar1;
  long *in_RDX;
  long *in_RSI;
  int retval;
  long liw;
  long lrw;
  sunindextype liw1;
  sunindextype lrw1;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffb8;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long *local_20;
  long *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_4 = idaLs_AccessLMem(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                             (IDAMem *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                             ,(IDALsMem *)0x11c45e);
  if (local_4 == 0) {
    *local_18 = 3;
    *local_20 = 0x21;
    if (*(long *)(*(long *)(*(long *)(local_28 + 0x1d0) + 8) + 0x20) != 0) {
      N_VSpace(*(undefined8 *)(local_28 + 0x1d0),&local_38,&local_40);
      *local_18 = local_38 * 3 + *local_18;
      *local_20 = local_40 * 3 + *local_20;
    }
    if ((*(long *)(*(long *)(*(long *)(local_30 + 0x20) + 8) + 0x60) != 0) &&
       (iVar1 = SUNLinSolSpace(*(undefined8 *)(local_30 + 0x20),&stack0xffffffffffffffb8,
                               &stack0xffffffffffffffb0), iVar1 == 0)) {
      *local_18 = (long)in_stack_ffffffffffffffb8 + *local_18;
      *local_20 = (long)(in_stack_ffffffffffffffb0 + *local_20);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int IDAGetLinWorkSpace(void* ida_mem, long int* lenrwLS, long int* leniwLS)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  sunindextype lrw1, liw1;
  long int lrw, liw;
  int retval;

  /* access IDALsMem structure */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  /* start with fixed sizes plus vector/matrix pointers */
  *lenrwLS = 3;
  *leniwLS = 33;

  /* add N_Vector sizes */
  if (IDA_mem->ida_tempv1->ops->nvspace)
  {
    N_VSpace(IDA_mem->ida_tempv1, &lrw1, &liw1);
    *lenrwLS += 3 * lrw1;
    *leniwLS += 3 * liw1;
  }

  /* add LS sizes */
  if (idals_mem->LS->ops->space)
  {
    retval = SUNLinSolSpace(idals_mem->LS, &lrw, &liw);
    if (retval == 0)
    {
      *lenrwLS += lrw;
      *leniwLS += liw;
    }
  }

  return (IDALS_SUCCESS);
}